

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_2d_sse4.c
# Opt level: O1

void av1_highbd_dist_wtd_convolve_2d_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  int16_t *piVar1;
  undefined2 *puVar2;
  uint16_t *puVar3;
  undefined2 *puVar4;
  undefined2 *puVar5;
  undefined2 *puVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  char cVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint uVar31;
  byte bVar32;
  byte bVar33;
  uint uVar34;
  CONV_BUF_TYPE *pCVar35;
  uint uVar36;
  undefined1 *puVar37;
  int iVar38;
  long lVar39;
  int iVar40;
  ulong uVar41;
  int iVar42;
  long lVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  short sVar56;
  int iVar57;
  short sVar65;
  int iVar66;
  short sVar68;
  int iVar69;
  short sVar70;
  short sVar71;
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  int iVar72;
  undefined1 auVar62 [16];
  short sVar64;
  short sVar67;
  undefined1 auVar63 [16];
  short sVar73;
  int iVar74;
  int iVar89;
  int iVar90;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  int iVar91;
  undefined1 auVar88 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar100 [16];
  short local_8b88;
  short sStack_8b86;
  uint local_8b68;
  undefined1 local_8b38 [1792];
  undefined1 local_8438 [33800];
  undefined1 auVar59 [16];
  undefined1 auVar77 [16];
  undefined1 auVar82 [16];
  undefined1 auVar78 [16];
  undefined1 auVar83 [16];
  undefined1 auVar79 [16];
  undefined1 auVar84 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  
  puVar37 = local_8b38;
  cVar20 = (char)bd + '\x0e';
  uVar8 = conv_params->round_1;
  iVar40 = uVar8 + conv_params->round_0;
  bVar32 = cVar20 - (char)iVar40;
  uVar31 = 0xe - iVar40;
  uVar36 = 0xff;
  if (bd == 0xc) {
    uVar36 = 0xfff;
  }
  uVar34 = 0x3ff;
  if (bd != 10) {
    uVar34 = uVar36;
  }
  bVar33 = (byte)conv_params->round_0;
  uVar7 = filter_params_y->taps;
  uVar36 = (h + (uint)uVar7) - 1;
  if (0 < (int)uVar36) {
    iVar40 = ((1 << (bVar33 & 0x1f)) >> 1) + (1 << ((char)bd + 6U & 0x1f));
    auVar48 = ZEXT416((uint)conv_params->round_0);
    piVar1 = filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)filter_params_x->taps;
    uVar21 = *(undefined4 *)piVar1;
    uVar22 = *(undefined4 *)(piVar1 + 2);
    uVar23 = *(undefined4 *)(piVar1 + 4);
    uVar24 = *(undefined4 *)(piVar1 + 6);
    auVar51._4_4_ = uVar21;
    auVar51._0_4_ = uVar21;
    auVar51._8_4_ = uVar21;
    auVar51._12_4_ = uVar21;
    auVar49._4_4_ = uVar22;
    auVar49._0_4_ = uVar22;
    auVar49._8_4_ = uVar22;
    auVar49._12_4_ = uVar22;
    auVar50._4_4_ = uVar23;
    auVar50._0_4_ = uVar23;
    auVar50._8_4_ = uVar23;
    auVar50._12_4_ = uVar23;
    in_XMM5._4_4_ = uVar24;
    in_XMM5._0_4_ = uVar24;
    in_XMM5._8_4_ = uVar24;
    in_XMM5._12_4_ = uVar24;
    lVar39 = (long)src +
             (0x12 - ((ulong)(filter_params_x->taps >> 1) * 2 +
                     (long)(int)(((uVar7 >> 1) - 1) * src_stride) * 2));
    uVar41 = 0;
    do {
      if (0 < w) {
        lVar43 = 0;
        do {
          auVar52 = *(undefined1 (*) [16])(lVar39 + -0x10 + lVar43 * 2);
          auVar93 = *(undefined1 (*) [16])(lVar39 + lVar43 * 2);
          auVar13._16_16_ = auVar93;
          auVar13._0_16_ = auVar52;
          auVar14._16_16_ = auVar93;
          auVar14._0_16_ = auVar52;
          auVar54 = pmaddwd(auVar14._8_16_,auVar50);
          auVar15._16_16_ = auVar93;
          auVar15._0_16_ = auVar52;
          auVar55 = pmaddwd(auVar15._12_16_,in_XMM5);
          auVar16._16_16_ = auVar93;
          auVar16._0_16_ = auVar52;
          auVar17._16_16_ = auVar93;
          auVar17._0_16_ = auVar52;
          auVar18._16_16_ = auVar93;
          auVar18._0_16_ = auVar52;
          auVar19._16_16_ = auVar93;
          auVar19._0_16_ = auVar52;
          auVar52 = pmaddwd(auVar52,auVar51);
          auVar53 = pmaddwd(auVar13._4_16_,auVar49);
          auVar93._0_4_ =
               auVar52._0_4_ + iVar40 + auVar53._0_4_ + auVar55._0_4_ + auVar54._0_4_ >> auVar48;
          auVar93._4_4_ =
               auVar52._4_4_ + iVar40 + auVar53._4_4_ + auVar55._4_4_ + auVar54._4_4_ >> auVar48;
          auVar93._8_4_ =
               auVar52._8_4_ + iVar40 + auVar53._8_4_ + auVar55._8_4_ + auVar54._8_4_ >> auVar48;
          auVar93._12_4_ =
               auVar52._12_4_ + iVar40 + auVar53._12_4_ + auVar55._12_4_ + auVar54._12_4_ >> auVar48
          ;
          auVar53 = pmaddwd(auVar16._2_16_,auVar51);
          auVar55 = pmaddwd(auVar17._6_16_,auVar49);
          auVar75 = pmaddwd(auVar18._10_16_,auVar50);
          auVar52 = pmaddwd(auVar19._14_16_,in_XMM5);
          auVar54._0_4_ =
               auVar53._0_4_ + iVar40 + auVar75._0_4_ + auVar55._0_4_ + auVar52._0_4_ >> auVar48;
          auVar54._4_4_ =
               auVar53._4_4_ + iVar40 + auVar75._4_4_ + auVar55._4_4_ + auVar52._4_4_ >> auVar48;
          auVar54._8_4_ =
               auVar53._8_4_ + iVar40 + auVar75._8_4_ + auVar55._8_4_ + auVar52._8_4_ >> auVar48;
          auVar54._12_4_ =
               auVar53._12_4_ + iVar40 + auVar75._12_4_ + auVar55._12_4_ + auVar52._12_4_ >> auVar48
          ;
          auVar52 = packssdw(auVar93,auVar54);
          *(undefined1 (*) [16])(puVar37 + lVar43 * 2) = auVar52;
          lVar43 = lVar43 + 8;
        } while (lVar43 < w);
      }
      uVar41 = uVar41 + 1;
      lVar39 = lVar39 + (long)src_stride * 2;
      puVar37 = puVar37 + 0x100;
    } while (uVar41 != uVar36);
  }
  local_8b68 = (uint)uVar7;
  if (0 < h) {
    iVar38 = (1 << (bVar32 - 1 & 0x1f)) + (1 << (bVar32 & 0x1f));
    iVar40 = conv_params->fwd_offset;
    iVar9 = conv_params->bck_offset;
    auVar48 = pshuflw(in_XMM5,ZEXT416(uVar34),0);
    pCVar35 = conv_params->dst;
    iVar10 = conv_params->dst_stride;
    iVar11 = conv_params->do_average;
    iVar12 = conv_params->use_dist_wtd_comp_avg;
    iVar44 = (1 << ((byte)uVar31 & 0x1f)) >> 1;
    iVar42 = ((1 << ((byte)uVar8 & 0x1f)) >> 1) + (-1 << (cVar20 + ~bVar33 & 0x1f));
    auVar51 = ZEXT416(uVar8);
    piVar1 = filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * local_8b68;
    uVar21 = *(undefined4 *)piVar1;
    uVar22 = *(undefined4 *)(piVar1 + 2);
    uVar23 = *(undefined4 *)(piVar1 + 4);
    uVar24 = *(undefined4 *)(piVar1 + 6);
    auVar52._4_4_ = uVar21;
    auVar52._0_4_ = uVar21;
    auVar52._8_4_ = uVar21;
    auVar52._12_4_ = uVar21;
    auVar53._4_4_ = uVar22;
    auVar53._0_4_ = uVar22;
    auVar53._8_4_ = uVar22;
    auVar53._12_4_ = uVar22;
    auVar55._4_4_ = uVar23;
    auVar55._0_4_ = uVar23;
    auVar55._8_4_ = uVar23;
    auVar55._12_4_ = uVar23;
    auVar75._4_4_ = uVar24;
    auVar75._0_4_ = uVar24;
    auVar75._8_4_ = uVar24;
    auVar75._12_4_ = uVar24;
    iVar45 = iVar44 - iVar38;
    iVar46 = iVar44 - iVar38;
    iVar47 = iVar44 - iVar38;
    iVar44 = iVar44 - iVar38;
    puVar37 = local_8438;
    uVar41 = 0;
    do {
      if (0 < w) {
        lVar39 = 0;
        do {
          auVar49 = *(undefined1 (*) [16])(puVar37 + lVar39 * 2 + -0x700);
          puVar4 = (undefined2 *)(puVar37 + lVar39 * 2 + -0x600);
          auVar50 = *(undefined1 (*) [16])(puVar37 + lVar39 * 2 + -0x500);
          auVar79._0_12_ = auVar49._0_12_;
          auVar79._12_2_ = auVar49._6_2_;
          auVar79._14_2_ = puVar4[3];
          auVar78._12_4_ = auVar79._12_4_;
          auVar78._0_10_ = auVar49._0_10_;
          auVar78._10_2_ = puVar4[2];
          auVar77._10_6_ = auVar78._10_6_;
          auVar77._0_8_ = auVar49._0_8_;
          auVar77._8_2_ = auVar49._4_2_;
          auVar76._8_8_ = auVar77._8_8_;
          auVar76._6_2_ = puVar4[1];
          auVar76._4_2_ = auVar49._2_2_;
          auVar76._0_2_ = auVar49._0_2_;
          auVar76._2_2_ = *puVar4;
          puVar5 = (undefined2 *)(puVar37 + lVar39 * 2 + -0x400);
          auVar59._0_12_ = auVar50._0_12_;
          auVar59._12_2_ = auVar50._6_2_;
          auVar59._14_2_ = puVar5[3];
          auVar58._12_4_ = auVar59._12_4_;
          auVar58._0_10_ = auVar50._0_10_;
          auVar58._10_2_ = puVar5[2];
          auVar100._10_6_ = auVar58._10_6_;
          auVar100._0_8_ = auVar50._0_8_;
          auVar100._8_2_ = auVar50._4_2_;
          auVar85._8_8_ = auVar100._8_8_;
          auVar85._6_2_ = puVar5[1];
          auVar85._4_2_ = auVar50._2_2_;
          auVar85._0_2_ = auVar50._0_2_;
          auVar85._2_2_ = *puVar5;
          auVar93 = *(undefined1 (*) [16])(puVar37 + lVar39 * 2 + -0x300);
          puVar6 = (undefined2 *)(puVar37 + lVar39 * 2 + -0x200);
          auVar99._0_12_ = auVar93._0_12_;
          auVar99._12_2_ = auVar93._6_2_;
          auVar99._14_2_ = puVar6[3];
          auVar98._12_4_ = auVar99._12_4_;
          auVar98._0_10_ = auVar93._0_10_;
          auVar98._10_2_ = puVar6[2];
          auVar97._10_6_ = auVar98._10_6_;
          auVar97._0_8_ = auVar93._0_8_;
          auVar97._8_2_ = auVar93._4_2_;
          auVar96._8_8_ = auVar97._8_8_;
          auVar96._6_2_ = puVar6[1];
          auVar96._4_2_ = auVar93._2_2_;
          auVar96._0_2_ = auVar93._0_2_;
          auVar96._2_2_ = *puVar6;
          auVar54 = *(undefined1 (*) [16])(puVar37 + lVar39 * 2 + -0x100);
          puVar2 = (undefined2 *)(puVar37 + lVar39 * 2);
          auVar80 = pmaddwd(auVar76,auVar52);
          auVar60 = pmaddwd(auVar85,auVar53);
          auVar84._0_12_ = auVar54._0_12_;
          auVar84._12_2_ = auVar54._6_2_;
          auVar84._14_2_ = puVar2[3];
          auVar83._12_4_ = auVar84._12_4_;
          auVar83._0_10_ = auVar54._0_10_;
          auVar83._10_2_ = puVar2[2];
          auVar82._10_6_ = auVar83._10_6_;
          auVar82._0_8_ = auVar54._0_8_;
          auVar82._8_2_ = auVar54._4_2_;
          auVar81._8_8_ = auVar82._8_8_;
          auVar81._6_2_ = puVar2[1];
          auVar81._4_2_ = auVar54._2_2_;
          auVar81._0_2_ = auVar54._0_2_;
          auVar81._2_2_ = *puVar2;
          auVar100 = pmaddwd(auVar96,auVar55);
          auVar85 = pmaddwd(auVar81,auVar75);
          auVar86._0_4_ = auVar85._0_4_ + auVar100._0_4_ + auVar60._0_4_ + auVar80._0_4_;
          auVar86._4_4_ = auVar85._4_4_ + auVar100._4_4_ + auVar60._4_4_ + auVar80._4_4_;
          auVar86._8_4_ = auVar85._8_4_ + auVar100._8_4_ + auVar60._8_4_ + auVar80._8_4_;
          auVar86._12_4_ = auVar85._12_4_ + auVar100._12_4_ + auVar60._12_4_ + auVar80._12_4_;
          auVar95._2_2_ = puVar4[4];
          auVar95._0_2_ = auVar49._8_2_;
          auVar95._4_2_ = auVar49._10_2_;
          auVar95._6_2_ = puVar4[5];
          auVar95._8_2_ = auVar49._12_2_;
          auVar95._10_2_ = puVar4[6];
          auVar95._12_2_ = auVar49._14_2_;
          auVar95._14_2_ = puVar4[7];
          auVar80._2_2_ = puVar5[4];
          auVar80._0_2_ = auVar50._8_2_;
          auVar80._4_2_ = auVar50._10_2_;
          auVar80._6_2_ = puVar5[5];
          auVar80._8_2_ = auVar50._12_2_;
          auVar80._10_2_ = puVar5[6];
          auVar80._12_2_ = auVar50._14_2_;
          auVar80._14_2_ = puVar5[7];
          auVar60._2_2_ = puVar6[4];
          auVar60._0_2_ = auVar93._8_2_;
          auVar60._4_2_ = auVar93._10_2_;
          auVar60._6_2_ = puVar6[5];
          auVar60._8_2_ = auVar93._12_2_;
          auVar60._10_2_ = puVar6[6];
          auVar60._12_2_ = auVar93._14_2_;
          auVar60._14_2_ = puVar6[7];
          auVar92._2_2_ = puVar2[4];
          auVar92._0_2_ = auVar54._8_2_;
          auVar92._4_2_ = auVar54._10_2_;
          auVar92._6_2_ = puVar2[5];
          auVar92._8_2_ = auVar54._12_2_;
          auVar92._10_2_ = puVar2[6];
          auVar92._12_2_ = auVar54._14_2_;
          auVar92._14_2_ = puVar2[7];
          auVar54 = pmaddwd(auVar95,auVar52);
          auVar50 = pmaddwd(auVar80,auVar53);
          auVar49 = pmaddwd(auVar60,auVar55);
          auVar93 = pmaddwd(auVar92,auVar75);
          auVar94._0_4_ = auVar93._0_4_ + auVar49._0_4_ + auVar50._0_4_ + auVar54._0_4_;
          auVar94._4_4_ = auVar93._4_4_ + auVar49._4_4_ + auVar50._4_4_ + auVar54._4_4_;
          auVar94._8_4_ = auVar93._8_4_ + auVar49._8_4_ + auVar50._8_4_ + auVar54._8_4_;
          auVar94._12_4_ = auVar93._12_4_ + auVar49._12_4_ + auVar50._12_4_ + auVar54._12_4_;
          auVar61._0_4_ = (auVar86._0_4_ + iVar42 >> auVar51) + iVar38;
          auVar61._4_4_ = (auVar94._0_4_ + iVar42 >> auVar51) + iVar38;
          auVar61._8_4_ = (auVar86._4_4_ + iVar42 >> auVar51) + iVar38;
          auVar61._12_4_ = (auVar94._4_4_ + iVar42 >> auVar51) + iVar38;
          local_8b88 = auVar48._0_2_;
          sStack_8b86 = auVar48._2_2_;
          if (w < 8) {
            if (iVar11 == 0) {
              auVar49 = packusdw(auVar61,auVar61);
              *(long *)(pCVar35 + lVar39) = auVar49._0_8_;
            }
            else {
              auVar49 = pmovzxwd(auVar86,*(undefined8 *)(pCVar35 + lVar39));
              if (iVar12 == 0) {
                iVar57 = auVar61._0_4_ + auVar49._0_4_ >> 1;
                iVar66 = auVar61._4_4_ + auVar49._4_4_ >> 1;
                iVar69 = auVar61._8_4_ + auVar49._8_4_ >> 1;
                iVar72 = auVar61._12_4_ + auVar49._12_4_ >> 1;
              }
              else {
                auVar28._4_4_ = iVar40;
                auVar28._0_4_ = iVar40;
                auVar28._8_4_ = iVar40;
                auVar28._12_4_ = iVar40;
                auVar50 = pmulld(auVar49,auVar28);
                auVar25._4_4_ = iVar9;
                auVar25._0_4_ = iVar9;
                auVar25._8_4_ = iVar9;
                auVar25._12_4_ = iVar9;
                auVar49 = pmulld(auVar61,auVar25);
                iVar57 = auVar49._0_4_ + auVar50._0_4_ >> 4;
                iVar66 = auVar49._4_4_ + auVar50._4_4_ >> 4;
                iVar69 = auVar49._8_4_ + auVar50._8_4_ >> 4;
                iVar72 = auVar49._12_4_ + auVar50._12_4_ >> 4;
              }
              auVar49 = ZEXT416(uVar31);
              auVar62._0_4_ = iVar57 + iVar45 >> auVar49;
              auVar62._4_4_ = iVar66 + iVar46 >> auVar49;
              auVar62._8_4_ = iVar69 + iVar47 >> auVar49;
              auVar62._12_4_ = iVar72 + iVar44 >> auVar49;
              auVar49 = packusdw(auVar62,auVar62);
              sVar56 = auVar49._0_2_;
              sVar64 = auVar49._2_2_;
              sVar65 = auVar49._4_2_;
              sVar67 = auVar49._6_2_;
              *(ulong *)(dst0 + lVar39) =
                   CONCAT26((ushort)(sStack_8b86 < sVar67) * sStack_8b86 |
                            (ushort)(sStack_8b86 >= sVar67) * sVar67,
                            CONCAT24((ushort)(local_8b88 < sVar65) * local_8b88 |
                                     (ushort)(local_8b88 >= sVar65) * sVar65,
                                     CONCAT22((ushort)(sStack_8b86 < sVar64) * sStack_8b86 |
                                              (ushort)(sStack_8b86 >= sVar64) * sVar64,
                                              (ushort)(local_8b88 < sVar56) * local_8b88 |
                                              (ushort)(local_8b88 >= sVar56) * sVar56)));
            }
          }
          else {
            auVar87._0_4_ = (auVar86._8_4_ + iVar42 >> auVar51) + iVar38;
            auVar87._4_4_ = (auVar94._8_4_ + iVar42 >> auVar51) + iVar38;
            auVar87._8_4_ = (auVar86._12_4_ + iVar42 >> auVar51) + iVar38;
            auVar87._12_4_ = (auVar94._12_4_ + iVar42 >> auVar51) + iVar38;
            if (iVar11 == 0) {
              auVar49 = packusdw(auVar61,auVar87);
              *(undefined1 (*) [16])(pCVar35 + lVar39) = auVar49;
            }
            else {
              auVar49 = pmovzxwd(auVar94,*(undefined8 *)(pCVar35 + lVar39));
              if (iVar12 == 0) {
                iVar57 = auVar61._0_4_ + auVar49._0_4_ >> 1;
                iVar66 = auVar61._4_4_ + auVar49._4_4_ >> 1;
                iVar69 = auVar61._8_4_ + auVar49._8_4_ >> 1;
                iVar72 = auVar61._12_4_ + auVar49._12_4_ >> 1;
              }
              else {
                auVar29._4_4_ = iVar40;
                auVar29._0_4_ = iVar40;
                auVar29._8_4_ = iVar40;
                auVar29._12_4_ = iVar40;
                auVar49 = pmulld(auVar49,auVar29);
                auVar26._4_4_ = iVar9;
                auVar26._0_4_ = iVar9;
                auVar26._8_4_ = iVar9;
                auVar26._12_4_ = iVar9;
                auVar50 = pmulld(auVar61,auVar26);
                iVar57 = auVar50._0_4_ + auVar49._0_4_ >> 4;
                iVar66 = auVar50._4_4_ + auVar49._4_4_ >> 4;
                iVar69 = auVar50._8_4_ + auVar49._8_4_ >> 4;
                iVar72 = auVar50._12_4_ + auVar49._12_4_ >> 4;
              }
              auVar49 = pmovzxwd(auVar49,*(undefined8 *)(pCVar35 + lVar39 + 4));
              if (iVar12 == 0) {
                iVar74 = auVar87._0_4_ + auVar49._0_4_ >> 1;
                iVar89 = auVar87._4_4_ + auVar49._4_4_ >> 1;
                iVar90 = auVar87._8_4_ + auVar49._8_4_ >> 1;
                iVar91 = auVar87._12_4_ + auVar49._12_4_ >> 1;
              }
              else {
                auVar30._4_4_ = iVar40;
                auVar30._0_4_ = iVar40;
                auVar30._8_4_ = iVar40;
                auVar30._12_4_ = iVar40;
                auVar50 = pmulld(auVar49,auVar30);
                auVar27._4_4_ = iVar9;
                auVar27._0_4_ = iVar9;
                auVar27._8_4_ = iVar9;
                auVar27._12_4_ = iVar9;
                auVar49 = pmulld(auVar87,auVar27);
                iVar74 = auVar49._0_4_ + auVar50._0_4_ >> 4;
                iVar89 = auVar49._4_4_ + auVar50._4_4_ >> 4;
                iVar90 = auVar49._8_4_ + auVar50._8_4_ >> 4;
                iVar91 = auVar49._12_4_ + auVar50._12_4_ >> 4;
              }
              auVar49 = ZEXT416(uVar31);
              auVar63._0_4_ = iVar57 + iVar45 >> auVar49;
              auVar63._4_4_ = iVar66 + iVar46 >> auVar49;
              auVar63._8_4_ = iVar69 + iVar47 >> auVar49;
              auVar63._12_4_ = iVar72 + iVar44 >> auVar49;
              auVar88._0_4_ = iVar74 + iVar45 >> auVar49;
              auVar88._4_4_ = iVar89 + iVar46 >> auVar49;
              auVar88._8_4_ = iVar90 + iVar47 >> auVar49;
              auVar88._12_4_ = iVar91 + iVar44 >> auVar49;
              auVar49 = packusdw(auVar63,auVar88);
              sVar56 = auVar49._0_2_;
              sVar64 = auVar49._2_2_;
              sVar65 = auVar49._4_2_;
              sVar67 = auVar49._6_2_;
              sVar68 = auVar49._8_2_;
              sVar70 = auVar49._10_2_;
              sVar71 = auVar49._12_2_;
              sVar73 = auVar49._14_2_;
              puVar3 = dst0 + lVar39;
              *puVar3 = (ushort)(local_8b88 < sVar56) * local_8b88 |
                        (ushort)(local_8b88 >= sVar56) * sVar56;
              puVar3[1] = (ushort)(sStack_8b86 < sVar64) * sStack_8b86 |
                          (ushort)(sStack_8b86 >= sVar64) * sVar64;
              puVar3[2] = (ushort)(local_8b88 < sVar65) * local_8b88 |
                          (ushort)(local_8b88 >= sVar65) * sVar65;
              puVar3[3] = (ushort)(sStack_8b86 < sVar67) * sStack_8b86 |
                          (ushort)(sStack_8b86 >= sVar67) * sVar67;
              puVar3[4] = (ushort)(local_8b88 < sVar68) * local_8b88 |
                          (ushort)(local_8b88 >= sVar68) * sVar68;
              puVar3[5] = (ushort)(sStack_8b86 < sVar70) * sStack_8b86 |
                          (ushort)(sStack_8b86 >= sVar70) * sVar70;
              puVar3[6] = (ushort)(local_8b88 < sVar71) * local_8b88 |
                          (ushort)(local_8b88 >= sVar71) * sVar71;
              puVar3[7] = (ushort)(sStack_8b86 < sVar73) * sStack_8b86 |
                          (ushort)(sStack_8b86 >= sVar73) * sVar73;
            }
          }
          lVar39 = lVar39 + 8;
        } while (lVar39 < w);
      }
      uVar41 = uVar41 + 1;
      pCVar35 = pCVar35 + iVar10;
      dst0 = dst0 + dst_stride0;
      puVar37 = puVar37 + 0x100;
    } while (uVar41 != (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_sse4_1(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params, int bd) {
  DECLARE_ALIGNED(16, int16_t,
                  im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE]);
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = MAX_SB_SIZE;
  int i, j;
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi32((1 << rounding_shift) >> 1);
  const __m128i clip_pixel_to_bd =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  /* Horizontal filter */
  {
    const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
        filter_params_x, subpel_x_qn & SUBPEL_MASK);
    const __m128i coeffs_x = _mm_loadu_si128((__m128i *)x_filter);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_x, coeffs_x);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_x, coeffs_x);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const = _mm_set1_epi32(
        ((1 << conv_params->round_0) >> 1) + (1 << (bd + FILTER_BITS - 1)));
    const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_0);

    for (i = 0; i < im_h; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i data =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
        const __m128i data2 =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j + 8]);

        // Filter even-index pixels
        const __m128i res_0 = _mm_madd_epi16(data, coeff_01);
        const __m128i res_2 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 4), coeff_23);
        const __m128i res_4 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 8), coeff_45);
        const __m128i res_6 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 12), coeff_67);

        __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_4),
                                         _mm_add_epi32(res_2, res_6));
        res_even =
            _mm_sra_epi32(_mm_add_epi32(res_even, round_const), round_shift);

        // Filter odd-index pixels
        const __m128i res_1 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 2), coeff_01);
        const __m128i res_3 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 6), coeff_23);
        const __m128i res_5 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 10), coeff_45);
        const __m128i res_7 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 14), coeff_67);

        __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_5),
                                        _mm_add_epi32(res_3, res_7));
        res_odd =
            _mm_sra_epi32(_mm_add_epi32(res_odd, round_const), round_shift);

        // Pack in the column order 0, 2, 4, 6, 1, 3, 5, 7
        __m128i res = _mm_packs_epi32(res_even, res_odd);
        _mm_storeu_si128((__m128i *)&im_block[i * im_stride + j], res);
      }
    }
  }

  /* Vertical filter */
  {
    const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
        filter_params_y, subpel_y_qn & SUBPEL_MASK);
    const __m128i coeffs_y = _mm_loadu_si128((__m128i *)y_filter);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const = _mm_set1_epi32(
        ((1 << conv_params->round_1) >> 1) -
        (1 << (bd + 2 * FILTER_BITS - conv_params->round_0 - 1)));
    const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_1);

    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        // Filter even-index pixels
        const int16_t *data = &im_block[i * im_stride + j];
        const __m128i src_0 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 0 * im_stride),
                               *(__m128i *)(data + 1 * im_stride));
        const __m128i src_2 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 2 * im_stride),
                               *(__m128i *)(data + 3 * im_stride));
        const __m128i src_4 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 4 * im_stride),
                               *(__m128i *)(data + 5 * im_stride));
        const __m128i src_6 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 6 * im_stride),
                               *(__m128i *)(data + 7 * im_stride));

        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

        const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                               _mm_add_epi32(res_4, res_6));

        // Filter odd-index pixels
        const __m128i src_1 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 0 * im_stride),
                               *(__m128i *)(data + 1 * im_stride));
        const __m128i src_3 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 2 * im_stride),
                               *(__m128i *)(data + 3 * im_stride));
        const __m128i src_5 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 4 * im_stride),
                               *(__m128i *)(data + 5 * im_stride));
        const __m128i src_7 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 6 * im_stride),
                               *(__m128i *)(data + 7 * im_stride));

        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

        const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                              _mm_add_epi32(res_5, res_7));

        // Rearrange pixels back into the order 0 ... 7
        const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

        const __m128i res_lo_round =
            _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);

        const __m128i res_unsigned_lo =
            _mm_add_epi32(res_lo_round, offset_const);

        if (w < 8) {
          if (do_average) {
            const __m128i data_0 =
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));

            const __m128i data_ref_0 = _mm_cvtepu16_epi32(data_0);

            const __m128i comp_avg_res =
                highbd_comp_avg_sse4_1(&data_ref_0, &res_unsigned_lo, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);

            const __m128i round_result = highbd_convolve_rounding_sse2(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m128i res_16b =
                _mm_packus_epi32(round_result, round_result);
            const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
          } else {
            const __m128i res_16b =
                _mm_packus_epi32(res_unsigned_lo, res_unsigned_lo);
            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_16b);
          }
        } else {
          const __m128i res_hi_round =
              _mm_sra_epi32(_mm_add_epi32(res_hi, round_const), round_shift);

          const __m128i res_unsigned_hi =
              _mm_add_epi32(res_hi_round, offset_const);

          if (do_average) {
            const __m128i data_lo =
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));
            const __m128i data_hi =
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j + 4]));

            const __m128i data_ref_0_lo = _mm_cvtepu16_epi32(data_lo);
            const __m128i data_ref_0_hi = _mm_cvtepu16_epi32(data_hi);

            const __m128i comp_avg_res_lo =
                highbd_comp_avg_sse4_1(&data_ref_0_lo, &res_unsigned_lo, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_hi =
                highbd_comp_avg_sse4_1(&data_ref_0_hi, &res_unsigned_hi, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);

            const __m128i round_result_lo =
                highbd_convolve_rounding_sse2(&comp_avg_res_lo, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_hi =
                highbd_convolve_rounding_sse2(&comp_avg_res_hi, &offset_const,
                                              &rounding_const, rounding_shift);

            const __m128i res_16b =
                _mm_packus_epi32(round_result_lo, round_result_hi);
            const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
          } else {
            const __m128i res_16b =
                _mm_packus_epi32(res_unsigned_lo, res_unsigned_hi);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_16b);
          }
        }
      }
    }
  }
}